

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchRex2(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2) {
    if ((Instrux->FeatMode & 0x10) == 0) {
      Instrux_local._4_4_ = 0;
    }
    else if (Size < (ulong)Offset + 2) {
      Instrux_local._4_4_ = 0x80000001;
    }
    else {
      *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffffffd | 2;
      *(uint *)Instrux = *(uint *)Instrux & 0xfff0ffff;
      (Instrux->field_73).Rex = *(ND_REX *)(Code + (int)(uint)Offset);
      *(ND_UINT8 *)((long)&Instrux->field_73 + 1) = Code[(int)(Offset + 1)];
      if ((*(uint *)&Instrux->field_0x5 & 1) == 0) {
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xfffffffd |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 2 & 1) << 1);
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xffffffef |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 6 & 1) << 4);
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xfffffffb |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 1 & 1) << 2);
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xffffffdf |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 5 & 1) << 5);
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xfffffff7 |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) & 1) << 3);
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xffffffbf |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 4 & 1) << 6);
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                       ((uint)Instrux->Exs & 0xfffffffe |
                       (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 3 & 1));
        Instrux->Length = Instrux->Length + '\x02';
        if (Instrux->Length < 0x10) {
          Instrux_local._4_4_ = 0;
        }
        else {
          Instrux_local._4_4_ = 0x80000003;
        }
      }
      else {
        Instrux_local._4_4_ = 0x80000004;
      }
    }
  }
  else {
    Instrux_local._4_4_ = 0;
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdFetchRex2(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
{
    if (ND_CODE_64 != Instrux->DefCode)
    {
        // AAD instruction outside 64-bit mode.
        return ND_STATUS_SUCCESS;
    }

    if (!(Instrux->FeatMode & ND_FEAT_APX))
    {
        // APX not enabled, #UD.
        return ND_STATUS_SUCCESS;
    }

    // One more byte has to follow.
    RET_GT((ND_SIZET)Offset + 2, Size, ND_STATUS_BUFFER_TOO_SMALL);

    // This is REX2.
    Instrux->HasRex2 = ND_TRUE;
    Instrux->EncMode = ND_ENCM_LEGACY;
    Instrux->Rex2.Rex2[0] = Code[Offset + 0];
    Instrux->Rex2.Rex2[1] = Code[Offset + 1];

    // REX illegal with REX2.
    if (Instrux->HasRex)
    {
        return ND_STATUS_INVALID_PREFIX_SEQUENCE;
    }

    // Fill in the generic extension bits
    Instrux->Exs.r = Instrux->Rex2.r3;
    Instrux->Exs.rp = Instrux->Rex2.r4;
    Instrux->Exs.x = Instrux->Rex2.x3;
    Instrux->Exs.x4 = Instrux->Rex2.x4;
    Instrux->Exs.b = Instrux->Rex2.b3;
    Instrux->Exs.b4 = Instrux->Rex2.b4;
    Instrux->Exs.w = Instrux->Rex2.w;

    // Update Instrux length & offset, and make sure we don't exceed 15 bytes.
    Instrux->Length += 2;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}